

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O3

QIcon __thiscall QCss::Declaration::iconValue(Declaration *this)

{
  Declaration DVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  QMetaType QVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long *in_RSI;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  QIcon *other;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  Mode local_90;
  State local_8c;
  QPixmap local_78;
  Declaration local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *in_RSI;
  if (*(ulong *)(lVar4 + 0x58) < 4) {
    (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
    QIcon::QIcon((QIcon *)this);
    uVar9 = 0;
    do {
      if ((*(long *)(*in_RSI + 0x38) <= (long)(int)uVar9) ||
         (*(int *)(*(long *)(*in_RSI + 0x30) + (long)(int)uVar9 * 0x28) != 7)) break;
      local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toString();
      uVar11 = uVar9 + 1;
      uVar7 = (ulong)uVar11;
      uVar12 = (ulong)(int)uVar11;
      lVar4 = *in_RSI;
      if (*(ulong *)(lVar4 + 0x38) == uVar12) {
        local_8c = Off;
        local_90 = Normal;
        uVar8 = uVar9;
      }
      else {
        uVar8 = uVar9 + 2;
        uVar11 = uVar9 + 3;
        lVar13 = uVar12 * 0x28 + 8;
        bVar2 = true;
        local_8c = Off;
        local_90 = Normal;
        do {
          uVar10 = uVar9;
          uVar6 = (uint)uVar7;
          if (*(int *)(*(long *)(lVar4 + 0x30) + -8 + lVar13) != 6) {
            uVar11 = uVar10 + 1;
            uVar8 = uVar10;
            goto LAB_005dd645;
          }
          iVar3 = ::QVariant::toInt((bool *)(*(long *)(lVar4 + 0x30) + lVar13));
          switch(iVar3) {
          case 0x51:
            local_90 = Disabled;
            break;
          case 0x52:
            local_90 = Active;
            break;
          case 0x53:
            local_90 = Selected;
            break;
          case 0x54:
            local_8c = On;
            break;
          case 0x55:
            local_8c = Off;
            break;
          default:
            if (iVar3 == 1) {
              local_90 = Normal;
            }
          }
          if (!bVar2) goto LAB_005dd645;
          uVar12 = uVar12 + 1;
          lVar4 = *in_RSI;
          lVar13 = lVar13 + 0x28;
          bVar2 = false;
          uVar7 = uVar12 & 0xffffffff;
          uVar9 = uVar10 + 1;
        } while (uVar12 != *(ulong *)(lVar4 + 0x38));
        uVar11 = uVar10 + 2;
        uVar8 = uVar6;
      }
LAB_005dd645:
      bVar2 = QIcon::isNull((QIcon *)this);
      if (bVar2) {
        QIcon::QIcon((QIcon *)&local_60,(QString *)&local_58);
        DVar1.d.d.ptr = local_60.d.d.ptr;
        local_60.d.d.ptr =
             (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
             (totally_ordered_wrapper<QCss::Declaration::DeclarationData_*>)0x0;
        local_78.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)(this->d).d.ptr;
        (this->d).d.ptr = (DeclarationData *)DVar1;
        QIcon::~QIcon((QIcon *)&local_78);
        QIcon::~QIcon((QIcon *)&local_60);
      }
      else {
        QPixmap::QPixmap(&local_78,(QString *)&local_58,(char *)0x0,(ImageConversionFlags)0x0);
        QIcon::addPixmap((QIcon *)this,&local_78,local_90,local_8c);
        QPixmap::~QPixmap(&local_78);
      }
      lVar13 = (long)(int)uVar11;
      lVar4 = *(long *)(*in_RSI + 0x38);
      uVar9 = uVar11;
      if ((lVar4 != lVar13) &&
         (uVar9 = uVar8 + 2, *(int *)(*(long *)(*in_RSI + 0x30) + lVar13 * 0x28) != 0xb)) {
        uVar9 = uVar11;
      }
      if ((InterfaceType *)local_58.shared != (InterfaceType *)0x0) {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + -1;
        UNLOCK();
        if (*(int *)local_58.shared == 0) {
          QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
        }
      }
    } while (lVar4 != lVar13);
    ::QVariant::QVariant((QVariant *)&local_58,(QMetaType)0x7d1a18,this);
    ::QVariant::operator=((QVariant *)(*in_RSI + 0x40),(QVariant *)&local_58);
    ::QVariant::~QVariant((QVariant *)&local_58);
  }
  else {
    other = (QIcon *)(lVar4 + 0x40);
    local_58.shared = (PrivateShared *)&QtPrivate::QMetaTypeInterfaceWrapper<QIcon>::metaType;
    local_78.super_QPaintDevice._vptr_QPaintDevice =
         (_func_int **)(*(ulong *)(lVar4 + 0x58) & 0xfffffffffffffffc);
    bVar2 = comparesEqual((QMetaType *)&local_78,(QMetaType *)&local_58.shared);
    if (bVar2) {
      if ((*(byte *)(lVar4 + 0x58) & 1) != 0) {
        other = (QIcon *)((long)&other->d->engine + (long)*(int *)((long)&other->d->engine + 4));
      }
      QIcon::QIcon((QIcon *)this,other);
    }
    else {
      (this->d).d.ptr = (DeclarationData *)&DAT_aaaaaaaaaaaaaaaa;
      QIcon::QIcon((QIcon *)this);
      QVar5.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if ((*(byte *)(lVar4 + 0x58) & 1) != 0) {
        other = (QIcon *)((long)&other->d->engine + (long)*(int *)((long)&other->d->engine + 4));
      }
      QMetaType::convert(QVar5,other,(QMetaType)local_58.shared,this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon Declaration::iconValue() const
{
    if (d->parsed.isValid())
        return qvariant_cast<QIcon>(d->parsed);

    QIcon icon;
    for (int i = 0; i < d->values.size();) {
        const Value &value = d->values.at(i++);
        if (value.type != Value::Uri)
            break;
        QString uri = value.variant.toString();
        QIcon::Mode mode = QIcon::Normal;
        QIcon::State state = QIcon::Off;
        for (int j = 0; j < 2; j++) {
            if (i != d->values.size() && d->values.at(i).type == Value::KnownIdentifier) {
                switch (d->values.at(i).variant.toInt()) {
                case Value_Disabled: mode = QIcon::Disabled; break;
                case Value_Active: mode = QIcon::Active; break;
                case Value_Selected: mode = QIcon::Selected; break;
                case Value_Normal: mode = QIcon::Normal; break;
                case Value_On: state = QIcon::On; break;
                case Value_Off: state = QIcon::Off; break;
                default: break;
                }
                ++i;
            } else {
                break;
            }
        }

        // QIcon is soo broken
        if (icon.isNull())
            icon = QIcon(uri);
        else
            icon.addPixmap(uri, mode, state);

        if (i == d->values.size())
            break;

        if (d->values.at(i).type == Value::TermOperatorComma)
            i++;
    }

    d->parsed = QVariant::fromValue<QIcon>(icon);
    return icon;
}